

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> __thiscall
kj::heap<kj::(anonymous_namespace)::MultipleDerivedDynamic,int,int,bool&>
          (kj *this,int *params,int *params_1,bool *params_2)

{
  int iVar1;
  undefined8 *puVar2;
  Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> OVar3;
  
  puVar2 = (undefined8 *)operator_new(0x28);
  iVar1 = *params_1;
  *(int *)(puVar2 + 1) = *params;
  *(int *)(puVar2 + 3) = iVar1;
  *puVar2 = &PTR_foo_001c5910;
  puVar2[2] = &PTR_bar_001c5928;
  puVar2[4] = params_2;
  *(undefined8 **)this =
       &_::HeapDisposer<kj::(anonymous_namespace)::MultipleDerivedDynamic>::instance;
  *(undefined8 **)(this + 8) = puVar2;
  OVar3.ptr._0_4_ = iVar1;
  OVar3.disposer = (Disposer *)this;
  OVar3.ptr._4_4_ = 0;
  return OVar3;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}